

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall
kj::(anonymous_namespace)::HttpClientAdapter::ResponseImpl::~ResponseImpl(ResponseImpl *this)

{
  anon_unknown_31::HttpClientAdapter::ResponseImpl::~ResponseImpl((ResponseImpl *)(this + -8));
  return;
}

Assistant:

ResponseImpl(kj::HttpMethod method,
                 kj::Own<kj::PromiseFulfiller<HttpClient::Response>> fulfiller)
        : method(method), fulfiller(kj::mv(fulfiller)) {}